

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBool
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  Exception *this_00;
  
  if ((byte)(**(char **)this - 0x19U) < 2) {
    return **(char **)this == '\x1a';
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,InvalidValueType,"Expecting type Bool");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }